

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O3

void __thiscall QCollator::QCollator(QCollator *this,QCollator *other)

{
  QCollatorPrivate *this_00;
  
  this_00 = other->d;
  this->d = this_00;
  if (this_00 != (QCollatorPrivate *)0x0) {
    if (this_00->dirty == true) {
      QCollatorPrivate::init(this_00,(EVP_PKEY_CTX *)other);
      this_00 = this->d;
    }
    LOCK();
    (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

QCollator::QCollator(const QCollator &other)
    : d(other.d)
{
    if (d) {
        // Ensure clean, lest both copies try to init() at the same time:
        d->ensureInitialized();
        d->ref.ref();
    }
}